

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

FNativeTexture * __thiscall FTexture::GetNative(FTexture *this,bool wrapping)

{
  FNativeTexture *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  
  pFVar1 = this->Native;
  if (pFVar1 != (FNativeTexture *)0x0) {
    iVar2 = (*pFVar1->_vptr_FNativeTexture[3])(pFVar1,wrapping);
    if ((char)iVar2 != '\0') {
      iVar2 = (*this->_vptr_FTexture[0xd])(this);
      if ((char)iVar2 != '\0') {
        (*this->Native->_vptr_FNativeTexture[2])();
      }
      return this->Native;
    }
    if (this->Native != (FNativeTexture *)0x0) {
      (*this->Native->_vptr_FNativeTexture[1])();
    }
  }
  iVar2 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x27])
                    (screen,this,wrapping);
  this->Native = (FNativeTexture *)CONCAT44(extraout_var,iVar2);
  return (FNativeTexture *)CONCAT44(extraout_var,iVar2);
}

Assistant:

FNativeTexture *FTexture::GetNative(bool wrapping)
{
	if (Native != NULL)
	{
		if (!Native->CheckWrapping(wrapping))
		{ // Texture's wrapping mode is not compatible.
		  // Destroy it and get a new one.
			delete Native;
		}
		else
		{
			if (CheckModified())
			{
				Native->Update();
			}
			return Native;
		}
	}
	Native = screen->CreateTexture(this, wrapping);
	return Native;
}